

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

int cmsys::SystemTools::Stat(char *path,Stat_t_conflict *buf)

{
  int iVar1;
  int *piVar2;
  allocator<char> local_31;
  string local_30;
  
  if (path == (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0xe;
    iVar1 = -1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,path,&local_31);
    iVar1 = Stat(&local_30,buf);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return iVar1;
}

Assistant:

int SystemTools::Stat(const char* path, SystemTools::Stat_t* buf)
{
  if (!path) {
    errno = EFAULT;
    return -1;
  }
  return SystemTools::Stat(std::string(path), buf);
}